

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O1

void d68000_dbra(m68k_info *info)

{
  uint displacement;
  ulong uVar1;
  
  uVar1 = (ulong)(info->pc - (int)info->baseAddress & info->address_mask);
  displacement = 0xaaaa;
  if (uVar1 + 2 <= info->code_len) {
    displacement = (uint)(ushort)(*(ushort *)(info->code + uVar1) << 8 |
                                 *(ushort *)(info->code + uVar1) >> 8);
  }
  info->pc = info->pc + 2;
  build_dbxx(info,0x4b,(int)(short)displacement & 0xffff0000U | displacement,displacement);
  return;
}

Assistant:

static unsigned int peek_imm_16(const m68k_info *info) { return m68k_read_safe_16((info), (info)->pc); }